

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O0

float __thiscall
anon_unknown.dwarf_45a12::MapDriver::scanObstacleMap
          (MapDriver *this,Vec3 *start,Vec3 *center,float arcAngle,int segments,
          float endRadiusChange,Color *beforeColor,Color *afterColor,Vec3 *returnObstaclePosition)

{
  bool bVar1;
  float in_ECX;
  TerrainMap *in_RDX;
  undefined8 *in_RSI;
  Vec3 *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float in_XMM1_Da;
  Vec3 VVar3;
  Vec3 *in_stack_00000008;
  float d2;
  Vec3 offset;
  Vec3 newPoint;
  float adjust;
  int i;
  bool obstacleFound;
  Vec3 oldPoint;
  float cos;
  float sin;
  float startRadius;
  float obstacleDistance;
  float step;
  Vec3 spoke;
  Color *in_stack_fffffffffffffe48;
  TerrainMap *this_00;
  float in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe5c;
  Vec3 *in_stack_fffffffffffffe60;
  AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *this_01;
  float angle;
  Vec3 local_128 [4];
  Vec3 local_f8;
  float local_ec;
  float local_e8;
  float local_e4;
  Vec3 local_e0;
  undefined8 local_cc;
  float local_c4;
  Vec3 local_c0;
  Vec3 local_b0;
  int local_a0;
  byte local_99;
  Vec3 local_98;
  undefined4 local_8c;
  undefined4 local_88;
  float local_84;
  Vec3 local_80;
  undefined8 local_6c;
  float local_64;
  float local_60;
  float local_5c;
  Vec3 local_58;
  undefined1 local_48 [56];
  undefined8 *local_10;
  
  local_48._36_4_ = in_XMM1_Da;
  local_48._40_4_ = in_ECX;
  local_48._44_4_ = in_XMM0_Da;
  local_48._48_8_ = in_RDX;
  local_10 = in_RSI;
  VVar3 = OpenSteer::Vec3::operator-
                    (in_stack_fffffffffffffe60,
                     (Vec3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  local_58.z = VVar3.z;
  local_48._8_4_ = local_58.z;
  local_58._0_8_ = VVar3._0_8_;
  local_48._0_4_ = local_58.x;
  local_48._4_4_ = local_58.y;
  local_5c = (float)local_48._44_4_ / (float)(int)local_48._40_4_;
  local_60 = 0.0;
  local_58 = VVar3;
  VVar3 = OpenSteer::Vec3::operator=(in_stack_00000008,&OpenSteer::Vec3::zero);
  local_80._0_8_ = VVar3._0_8_;
  local_6c._0_4_ = local_80.x;
  local_6c._4_4_ = local_80.y;
  local_80.z = VVar3.z;
  local_64 = local_80.z;
  local_80 = VVar3;
  if (((float)local_48._36_4_ != 0.0) || (NAN((float)local_48._36_4_))) {
    angle = OpenSteer::Vec3::length((Vec3 *)0x14045b);
  }
  else {
    angle = 0.0;
  }
  local_88 = 0;
  local_8c = 0;
  local_98._0_8_ = *local_10;
  local_98.z = *(float *)(local_10 + 1);
  local_99 = 0;
  local_84 = angle;
  for (local_a0 = 0; local_a0 < (int)local_48._40_4_; local_a0 = local_a0 + 1) {
    this_01 = (AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)local_48;
    VVar3 = OpenSteer::Vec3::rotateAboutGlobalY
                      (in_RDI,angle,(float *)this_01,
                       (float *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    local_c0.z = VVar3.z;
    local_b0.z = local_c0.z;
    local_c0._0_8_ = VVar3._0_8_;
    local_b0.x = local_c0.x;
    local_b0.y = local_c0.y;
    local_c0 = VVar3;
    VVar3 = OpenSteer::Vec3::operator=((Vec3 *)this_01,&local_b0);
    local_e0._0_8_ = VVar3._0_8_;
    local_cc._0_4_ = local_e0.x;
    local_cc._4_4_ = local_e0.y;
    local_e0.z = VVar3.z;
    local_c4 = local_e0.z;
    local_e0 = VVar3;
    if (((float)local_48._36_4_ != 0.0) || (NAN((float)local_48._36_4_))) {
      in_stack_fffffffffffffe58 = (float)(local_a0 + 1) / (float)(int)local_48._40_4_;
      local_e8 = 1.0;
      local_ec = OpenSteer::maxXXX(0.0,1.83881e-39);
      local_ec = local_ec / local_84;
      in_stack_fffffffffffffe5c =
           OpenSteer::interpolate<float>(in_stack_fffffffffffffe58,&local_e8,&local_ec);
    }
    else {
      in_stack_fffffffffffffe5c = 1.0;
    }
    this_00 = (TerrainMap *)local_48._48_8_;
    local_e4 = in_stack_fffffffffffffe5c;
    OpenSteer::Vec3::operator*((Vec3 *)this_01,in_stack_fffffffffffffe5c);
    VVar3 = OpenSteer::Vec3::operator+
                      ((Vec3 *)this_01,
                       (Vec3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    local_128[0]._0_8_ = VVar3._0_8_;
    local_f8.x = local_128[0].x;
    local_f8.y = local_128[0].y;
    local_128[0].z = VVar3.z;
    local_f8.z = local_128[0].z;
    if ((local_99 & 1) == 0) {
      OpenSteer::Vec3::operator-
                ((Vec3 *)this_01,
                 (Vec3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      fVar2 = OpenSteer::Vec3::length((Vec3 *)0x14072c);
      bVar1 = TerrainMap::isPassable(this_00,(Vec3 *)in_stack_fffffffffffffe48);
      if (!bVar1) {
        local_99 = 1;
        local_60 = fVar2 * 2.0 * 0.5 * (float)(local_a0 + 1);
        OpenSteer::Vec3::operator=(in_stack_00000008,&local_f8);
      }
      OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
      annotationLine(this_01,(Vec3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     &this_00->center,in_stack_fffffffffffffe48);
    }
    else {
      OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
      annotationLine(this_01,(Vec3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     &this_00->center,in_stack_fffffffffffffe48);
    }
    OpenSteer::Vec3::operator=(&local_98,&local_f8);
  }
  return local_60;
}

Assistant:

float scanObstacleMap (const Vec3& start,
                               const Vec3& center,
                               const float arcAngle,
                               const int segments,
                               const float endRadiusChange,
                               const Color& beforeColor,
                               const Color& afterColor,
                               Vec3& returnObstaclePosition)
        {
            // "spoke" is initially the vector from center to start,
            // which is then rotated step by step around center
            Vec3 spoke = start - center;
            // determine the angular step per segment
            const float step = arcAngle / segments;
            // store distance to, and position of first obstacle
            float obstacleDistance = 0;
            returnObstaclePosition = Vec3::zero;
            // for spiral "ramps" of changing radius
            const float startRadius = (endRadiusChange == 0) ? 0 : spoke.length(); 

            // traverse each segment along arc
            float sin=0, cos=0;
            Vec3 oldPoint = start;
            bool obstacleFound = false;
            for (int i = 0; i < segments; i++)
            {
                // rotate "spoke" to next step around circle
                // (sin and cos values get filled in on first call)
                spoke = spoke.rotateAboutGlobalY (step, sin, cos);

                // for spiral "ramps" of changing radius
                const float adjust = ((endRadiusChange == 0) ?
                                      1.0f :
                                      interpolate ((float)(i+1) / (float)segments,
                                                   1.0f,
                                                   (maxXXX (0,
                                                            (startRadius +
                                                             endRadiusChange))
                                                    / startRadius)));

                // construct new scan point: center point, offset by rotated
                // spoke (possibly adjusting the radius if endRadiusChange!=0)
                const Vec3 newPoint = center + (spoke * adjust);

                // once an obstacle if found "our work here is done" -- continue
                // to loop only for the sake of annotation (make that optional?)
                if (obstacleFound)
                {
                    annotationLine (oldPoint, newPoint, afterColor);
                }
                else
                {
                    // no obstacle found on this scan so far,
                    // scan map along current segment (a chord of the arc)
                    const Vec3 offset = newPoint - oldPoint;
                    const float d2 = offset.length() * 2;

                    // when obstacle found: set flag, save distance and position
                    if (! map->isPassable (newPoint))
                    {
                        obstacleFound = true;
                        obstacleDistance = d2 * 0.5f * (i+1);
                        returnObstaclePosition = newPoint;
                    }
                    annotationLine (oldPoint, newPoint, beforeColor);
                }
                // save new point for next time around loop
                oldPoint = newPoint;
            }
            // return distance to first obstacle (or zero if none found)
            return obstacleDistance;
        }